

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QWindow*>>
          (QtPrivate *this,QDebug debug,char *which,QList<QWindow_*> *c)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  QDebug *pQVar4;
  QWindow **ppQVar5;
  QDebug debug_00;
  QWindow **ppQVar6;
  QWindow *window;
  long in_FS_OFFSET;
  Stream *local_60 [2];
  _func_int **local_50;
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = (QSurfacePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar4,'(');
  ppQVar6 = (c->d).ptr;
  lVar2 = (c->d).size;
  ppQVar5 = ppQVar6 + lVar2;
  if (lVar2 == 0) goto LAB_002b5a16;
  local_50 = *(_func_int ***)debug.stream;
  window = (QWindow *)&local_50;
  *(int *)(local_50 + 5) = *(int *)(local_50 + 5) + 1;
  debug_00.stream = (Stream *)local_48;
  while( true ) {
    ::operator<<(debug_00,window);
    QDebug::~QDebug((QDebug *)debug_00.stream);
    QDebug::~QDebug((QDebug *)window);
    ppQVar6 = ppQVar6 + 1;
LAB_002b5a16:
    if (ppQVar6 == ppQVar5) break;
    pQVar4 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60[0] = pQVar4->stream;
    window = (QWindow *)local_60;
    local_60[0]->ref = local_60[0]->ref + 1;
    debug_00.stream = (Stream *)(local_60 + 1);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}